

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Admin.h
# Opt level: O3

void __thiscall Admin::resizePersons(Admin *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  University *pUVar4;
  Person *pPVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  Person *pPVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  ulong uVar12;
  byte bVar13;
  
  pUVar4 = Innopolis;
  bVar13 = 0;
  uVar1 = Innopolis->persons_count;
  iVar3 = uVar1 * 2;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar3;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x60),8) == 0) {
    uVar12 = SUB168(auVar2 * ZEXT816(0x60),0);
  }
  pPVar5 = (Person *)operator_new__(uVar12);
  if ((ulong)uVar1 != 0) {
    pPVar9 = pPVar5;
    do {
      pPVar9->_vptr_Person = (_func_int **)&PTR_CheckPassword_00108d98;
      pPVar9->gender = true;
      pPVar9->id = 0;
      pPVar9->access_level = 0;
      pPVar9->num_groups = 0;
      piVar6 = (int *)operator_new__(0);
      pPVar9->groups = piVar6;
      pPVar9 = pPVar9 + 1;
    } while (pPVar9 != pPVar5 + iVar3);
    if (0 < (int)uVar1) {
      pPVar9 = pUVar4->persons;
      lVar8 = 8;
      uVar12 = 0;
      do {
        puVar10 = (undefined8 *)((long)&pPVar9->_vptr_Person + lVar8);
        puVar11 = (undefined8 *)((long)&pPVar5->_vptr_Person + lVar8);
        for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar11 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
          puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
        }
        uVar12 = uVar12 + 1;
        lVar8 = lVar8 + 0x60;
      } while (uVar12 < uVar1);
    }
  }
  pUVar4->persons_count = iVar3;
  pUVar4->persons = pPVar5;
  return;
}

Assistant:

void resizePersons(){
        Person* resizesPersonList = new Person[Innopolis->persons_count*2];
        for(int i=0;i<Innopolis->persons_count;i++){
            resizesPersonList[i] = Innopolis->persons[i];
        }
        Innopolis->persons_count<<=1;
        Innopolis->persons = resizesPersonList;
    }